

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O1

int __thiscall ThreadParser::parse(ThreadParser *this,int fileNum)

{
  SAXParser *pSVar1;
  SAX2XMLReader *pSVar2;
  MemBufInputSource *this_00;
  DOMDocument *pDVar3;
  undefined4 in_register_00000034;
  DOMNode *node;
  char *exceptionMessage;
  
  this->fCheckSum = 0;
  if (gRunInfo.inMemory == true) {
    this_00 = (MemBufInputSource *)
              xercesc_4_0::XMemory::operator_new
                        ((XMemory *)0x48,CONCAT44(in_register_00000034,fileNum));
    xercesc_4_0::MemBufInputSource::MemBufInputSource
              (this_00,(uchar *)gRunInfo.files[fileNum].fileContent,gRunInfo.files[fileNum].fileSize
               ,gRunInfo.files[fileNum].uFileName,false,
               xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  else {
    this_00 = (MemBufInputSource *)0x0;
  }
  if (gRunInfo.dom == true) {
    xercesc_4_0::XercesDOMParser::resetDocumentPool();
    if (gRunInfo.inMemory == true) {
      xercesc_4_0::AbstractDOMParser::parse((InputSource *)this->fXercesDOMParser);
    }
    else {
      xercesc_4_0::AbstractDOMParser::parse((char *)this->fXercesDOMParser);
    }
    pDVar3 = (DOMDocument *)xercesc_4_0::AbstractDOMParser::getDocument();
    this->fDoc = pDVar3;
    node = (DOMNode *)(pDVar3 + 0x18);
    if (pDVar3 == (DOMDocument *)0x0) {
      node = (DOMNode *)0x0;
    }
    domCheckSum(this,node);
  }
  else if (gRunInfo.sax == true) {
    pSVar1 = this->fSAXParser;
    if (gRunInfo.inMemory == false) {
      (**(code **)(*(long *)pSVar1 + 0x40))(pSVar1,gRunInfo.files[fileNum].fileName);
    }
    else {
      (**(code **)(*(long *)pSVar1 + 0x30))(pSVar1,this_00);
    }
  }
  else {
    pSVar2 = this->fSAX2Parser;
    if (gRunInfo.inMemory == false) {
      (*pSVar2->_vptr_SAX2XMLReader[0x10])(pSVar2,gRunInfo.files[fileNum].fileName);
    }
    else {
      (*pSVar2->_vptr_SAX2XMLReader[0xe])(pSVar2,this_00);
    }
  }
  if (this_00 != (MemBufInputSource *)0x0) {
    (**(code **)(*(long *)this_00 + 8))(this_00);
  }
  return this->fCheckSum;
}

Assistant:

int ThreadParser::parse(int fileNum)
{
    MemBufInputSource *mbis = 0;
    InFileInfo        *fInfo = &gRunInfo.files[fileNum];
    bool              errors = false;

    fCheckSum = 0;

    if (gRunInfo.inMemory) {
        mbis = new  MemBufInputSource((const XMLByte *) fInfo->fileContent,
                                       fInfo->fileSize,
                                       fInfo->uFileName,
                                       false);
    }

    try
    {
        if (gRunInfo.dom) {
            // Do a DOM parse
            fXercesDOMParser->resetDocumentPool();
            if (gRunInfo.inMemory)
                fXercesDOMParser->parse(*mbis);
            else
                fXercesDOMParser->parse(fInfo->fileName);
            fDoc = fXercesDOMParser->getDocument();
            domCheckSum(fDoc);
        }
        else if (gRunInfo.sax) {
            // Do a SAX1 parse
            if (gRunInfo.inMemory)
                fSAXParser->parse(*mbis);
            else
                fSAXParser->parse(fInfo->fileName);
        }
        else {
            // Do a SAX2 parse
            if (gRunInfo.inMemory)
                fSAX2Parser->parse(*mbis);
            else
                fSAX2Parser->parse(fInfo->fileName);
        }
    }
    catch (const OutOfMemoryException&)
    {
	    fprintf(stderr, " during parsing: %s\n OutOfMemoryException.\n", fInfo->fileName);
	    errors = true;
    }
    catch (const XMLException& e)
    {
        char *exceptionMessage = XMLString::transcode(e.getMessage());
        fprintf(stderr, " during parsing: %s\n Exception message is: %s\n",
            fInfo->fileName, exceptionMessage);
        XMLString::release(&exceptionMessage);
        errors = true;
    }
    catch (const DOMException& toCatch)
    {
        fprintf(stderr, " during parsing: %s\n DOMException code is: %i\n",
            fInfo->fileName, toCatch.code);
        errors = true;
    }
    catch (const SAXParseException& e)
    {
        char *exceptionMessage = XMLString::transcode(e.getMessage());
        fprintf(stderr, " during parsing: %s\n Exception message is: %s\n",
            fInfo->fileName, exceptionMessage);
        XMLString::release(&exceptionMessage);
        errors = true;
    }
    catch (...)
    {
        fprintf(stderr, "Unexpected exception during parsing\n");
        errors = true;
    }

    delete mbis;
    if (errors) {
        fflush(stderr);
        return 0;  // if errors occurred, return zero as if checksum = 0;
    }
    return fCheckSum;
}